

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

bool goodform::json::parse_array(istream *input,any *v)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  vector<std::any,_std::allocator<std::any>_> *this;
  byte local_61;
  undefined1 local_58 [8];
  any elem;
  bool parseError;
  bool closingBraceFound;
  char c;
  vector<std::any,_std::allocator<std::any>_> local_38;
  any *local_18;
  any *v_local;
  istream *input_local;
  
  local_38.super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_38.super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_38.super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_18 = v;
  v_local = (any *)input;
  std::vector<std::any,_std::allocator<std::any>_>::vector(&local_38);
  std::any::operator=(local_18,&local_38);
  std::vector<std::any,_std::allocator<std::any>_>::~vector(&local_38);
  cVar1 = std::istream::get();
  elem._M_storage._2_1_ = 0;
  if (cVar1 == '[') {
    elem._M_storage._1_1_ = 0;
    elem._M_storage._3_1_ = 0x5b;
    while( true ) {
      local_61 = 0;
      if (((elem._M_storage._2_1_ & 1) == 0) && (local_61 = 0, (elem._M_storage._1_1_ & 1) == 0)) {
        local_61 = std::ios::good();
      }
      if ((local_61 & 1) == 0) break;
      strip_white_space((istream *)v_local);
      iVar3 = std::istream::peek();
      elem._M_storage._2_1_ = iVar3 == 0x5d;
      if ((bool)elem._M_storage._2_1_) {
        std::istream::seekg((long)v_local,_S_cur);
      }
      else {
        std::any::any((any *)local_58);
        bVar2 = deserialize((istream *)v_local,(any *)local_58);
        elem._M_storage._1_1_ = ~bVar2 & 1;
        this = get<std::vector<std::any,std::allocator<std::any>>>(local_18);
        std::vector<std::any,_std::allocator<std::any>_>::push_back(this,(value_type *)local_58);
        if ((elem._M_storage._1_1_ & 1) == 0) {
          strip_white_space((istream *)v_local);
          elem._M_storage._3_1_ = std::istream::peek();
          elem._M_storage._2_1_ = elem._M_storage._3_1_ == ']';
          if (((bool)elem._M_storage._2_1_) ||
             (elem._M_storage._1_1_ = elem._M_storage._3_1_ != ',', !(bool)elem._M_storage._1_1_)) {
            std::istream::seekg((long)v_local,_S_cur);
          }
        }
        std::any::~any((any *)local_58);
      }
    }
  }
  return (bool)(elem._M_storage._2_1_ & 1);
}

Assistant:

bool json::parse_array(std::istream& input, any& v)
  {
    v = goodform::array_t();
    char c = (char)input.get();
    bool closingBraceFound = false;
    if (c == '[')
    {
      bool parseError = false;
      while(!closingBraceFound && !parseError && input.good())
      {
        strip_white_space(input);
        if ((closingBraceFound = (input.peek() == ']')))
        {
          input.seekg(1, std::ios::cur);
        }
        else
        {
          any elem;
          parseError = !deserialize(input, elem);
          get<goodform::array_t>(v).push_back(std::move(elem));
          if (!parseError)
          {
            strip_white_space(input);
            c = (char)input.peek();
            if ((closingBraceFound = (c == ']')) || !(parseError = (c != ',')))
              input.seekg(1, std::ios::cur);
          }
        }
      }
    }
    return closingBraceFound;
  }